

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O3

CSubNet * LookupSubNet(CSubNet *__return_storage_ptr__,string *subnet_str)

{
  size_type sVar1;
  pointer pcVar2;
  char *pcVar3;
  DNSLookupFn dns_lookup_function;
  DNSLookupFn dns_lookup_function_00;
  long lVar4;
  undefined8 uVar5;
  bool bVar6;
  size_type sVar7;
  size_type sVar8;
  long in_FS_OFFSET;
  string_view str;
  uint8_t netmask;
  string netmask_str;
  string str_addr;
  undefined8 in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  CSubNet *pCVar9;
  _Any_data in_stack_fffffffffffffeb8;
  _Manager_type local_138;
  uint8_t local_121;
  _Any_data local_120;
  code *local_110;
  direct_or_indirect local_100;
  size_type local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  bool local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  _Storage<CNetAddr,_false> local_a8;
  byte local_88;
  _Storage<CNetAddr,_false> local_80;
  char local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CSubNet::CSubNet(__return_storage_ptr__);
  bVar6 = CSubNet::IsValid(__return_storage_ptr__);
  if (bVar6) {
    __assert_fail("!subnet.IsValid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp"
                  ,0x2f6,"CSubNet LookupSubNet(const std::string &)");
  }
  sVar8 = subnet_str->_M_string_length;
  if (sVar8 == 0) {
LAB_00d7bae4:
    sVar7 = 0xffffffffffffffff;
  }
  else {
    pcVar2 = (subnet_str->_M_dataplus)._M_p;
    sVar7 = 0;
    do {
      if (pcVar2[sVar7] == '\0') goto LAB_00d7be82;
      sVar7 = sVar7 + 1;
    } while (sVar8 != sVar7);
    do {
      sVar7 = sVar8 - 1;
      if (sVar8 == 0) goto LAB_00d7bae4;
      lVar4 = sVar8 - 1;
      sVar8 = sVar7;
    } while (pcVar2[lVar4] != '/');
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_58,subnet_str,0,sVar7);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&local_120,&g_dns_lookup_abi_cxx11_);
  dns_lookup_function.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffeb0;
  dns_lookup_function.super__Function_base._M_functor._M_unused._M_object =
       (void *)in_stack_fffffffffffffea8;
  dns_lookup_function._16_16_ = in_stack_fffffffffffffeb8;
  LookupHost((optional<CNetAddr> *)&local_80._M_value,&local_58,false,dns_lookup_function);
  if (local_110 != (code *)0x0) {
    (*local_110)(&local_120,&local_120,__destroy_functor);
  }
  if (local_60 == '\x01') {
    CService::CService((CService *)&local_a8._M_value,&local_80._M_value,0);
    MaybeFlipIPv6toCJDNS((CService *)&local_100.indirect_contents,(CService *)&local_a8._M_value);
    local_80._24_8_ = local_e8;
    sVar1 = local_f0;
    local_80._8_8_ = local_100._8_8_;
    uVar5 = local_100.indirect_contents.indirect;
    pcVar3 = local_100.indirect_contents.indirect;
    local_f0 = 0;
    if (local_60 == '\x01') {
      if ((uint)local_80._16_4_ < 0x11) {
        local_80._0_8_ = local_100.indirect_contents.indirect;
        local_80._8_8_ = local_100._8_8_;
        local_80._M_value.m_addr._size = sVar1;
        local_80._24_8_ = local_e8;
      }
      else {
        free((void *)local_80._0_8_);
        local_80._0_8_ = uVar5;
        local_80._M_value.m_addr._size = sVar1;
        if (0x10 < local_f0) {
          free(local_100.indirect_contents.indirect);
          local_100.indirect_contents.indirect = (char *)0x0;
        }
      }
    }
    else {
      local_80._0_8_ = local_100.indirect_contents.indirect;
      local_80._8_8_ = local_100._8_8_;
      local_80._M_value.m_addr._size = sVar1;
      local_80._24_8_ = local_e8;
      local_60 = '\x01';
    }
    pCVar9 = __return_storage_ptr__;
    if (0x10 < local_a8._M_value.m_addr._size) {
      free((void *)local_a8._0_8_);
    }
    if (sVar7 == 0xffffffffffffffff) {
      if (local_60 == '\0') {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_optional_access();
        }
        goto LAB_00d7c11e;
      }
      CSubNet::CSubNet((CSubNet *)&local_100.indirect_contents,&local_80._M_value);
      if (0x10 < (__return_storage_ptr__->network).m_addr._size) {
        free((__return_storage_ptr__->network).m_addr._union.indirect_contents.indirect);
      }
      (__return_storage_ptr__->network).m_addr._union.indirect_contents.indirect =
           local_100.indirect_contents.indirect;
      *(undefined8 *)((long)&(__return_storage_ptr__->network).m_addr._union + 8) = local_100._8_8_;
      (__return_storage_ptr__->network).m_addr._size = local_f0;
      local_f0 = 0;
      (__return_storage_ptr__->network).m_net = (undefined4)local_e8;
      (__return_storage_ptr__->network).m_scope_id = local_e8._4_4_;
      *(undefined8 *)__return_storage_ptr__->netmask = local_e0;
      *(undefined8 *)(__return_storage_ptr__->netmask + 8) = uStack_d8;
      __return_storage_ptr__->valid = local_d0;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_c8,subnet_str,sVar7 + 1,0xffffffffffffffff);
      str._M_str = local_c8._M_dataplus._M_p;
      str._M_len = local_c8._M_string_length;
      bVar6 = ParseUInt8(str,&local_121);
      if (bVar6) {
        if (local_60 == '\0') {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_bad_optional_access();
          }
          goto LAB_00d7c11e;
        }
        CSubNet::CSubNet((CSubNet *)&local_100.indirect_contents,&local_80._M_value,local_121);
        if (0x10 < (__return_storage_ptr__->network).m_addr._size) {
          free((__return_storage_ptr__->network).m_addr._union.indirect_contents.indirect);
        }
        (__return_storage_ptr__->network).m_addr._union.indirect_contents.indirect =
             local_100.indirect_contents.indirect;
        *(undefined8 *)((long)&(__return_storage_ptr__->network).m_addr._union + 8) =
             local_100._8_8_;
        (__return_storage_ptr__->network).m_addr._size = local_f0;
        local_f0 = 0;
        (__return_storage_ptr__->network).m_net = (undefined4)local_e8;
        (__return_storage_ptr__->network).m_scope_id = local_e8._4_4_;
        *(undefined8 *)__return_storage_ptr__->netmask = local_e0;
        *(undefined8 *)(__return_storage_ptr__->netmask + 8) = uStack_d8;
        __return_storage_ptr__->valid = local_d0;
      }
      else {
        std::
        function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
        ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                    *)&stack0xfffffffffffffeb8,&g_dns_lookup_abi_cxx11_);
        dns_lookup_function_00.super__Function_base._M_functor._8_8_ = pCVar9;
        dns_lookup_function_00.super__Function_base._M_functor._M_unused._M_object =
             (void *)in_stack_fffffffffffffea8;
        dns_lookup_function_00._16_16_ = in_stack_fffffffffffffeb8;
        LookupHost((optional<CNetAddr> *)&local_a8._M_value,&local_c8,false,dns_lookup_function_00);
        if (local_138 != (_Manager_type)0x0) {
          (*local_138)((_Any_data *)&stack0xfffffffffffffeb8,(_Any_data *)&stack0xfffffffffffffeb8,
                       __destroy_functor);
        }
        if (local_88 == 1) {
          if (local_60 == '\0') {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              std::__throw_bad_optional_access();
            }
            goto LAB_00d7c11e;
          }
          CSubNet::CSubNet((CSubNet *)&local_100.indirect_contents,&local_80._M_value,
                           &local_a8._M_value);
          if (0x10 < (__return_storage_ptr__->network).m_addr._size) {
            free((__return_storage_ptr__->network).m_addr._union.indirect_contents.indirect);
          }
          (__return_storage_ptr__->network).m_addr._union.indirect_contents.indirect =
               local_100.indirect_contents.indirect;
          *(undefined8 *)((long)&(__return_storage_ptr__->network).m_addr._union + 8) =
               local_100._8_8_;
          (__return_storage_ptr__->network).m_addr._size = local_f0;
          local_f0 = 0;
          (__return_storage_ptr__->network).m_net = (undefined4)local_e8;
          (__return_storage_ptr__->network).m_scope_id = local_e8._4_4_;
          __return_storage_ptr__->valid = local_d0;
          *(undefined8 *)__return_storage_ptr__->netmask = local_e0;
          *(undefined8 *)(__return_storage_ptr__->netmask + 8) = uStack_d8;
        }
        if (((local_88 & 1) != 0) && (local_88 = 0, 0x10 < local_a8._M_value.m_addr._size)) {
          free((void *)local_a8._0_8_);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((local_60 == '\x01') && (local_60 = '\0', 0x10 < local_80._M_value.m_addr._size)) {
    free((void *)local_80._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
LAB_00d7be82:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00d7c11e:
  __stack_chk_fail();
}

Assistant:

CSubNet LookupSubNet(const std::string& subnet_str)
{
    CSubNet subnet;
    assert(!subnet.IsValid());
    if (!ContainsNoNUL(subnet_str)) {
        return subnet;
    }

    const size_t slash_pos{subnet_str.find_last_of('/')};
    const std::string str_addr{subnet_str.substr(0, slash_pos)};
    std::optional<CNetAddr> addr{LookupHost(str_addr, /*fAllowLookup=*/false)};

    if (addr.has_value()) {
        addr = static_cast<CNetAddr>(MaybeFlipIPv6toCJDNS(CService{addr.value(), /*port=*/0}));
        if (slash_pos != subnet_str.npos) {
            const std::string netmask_str{subnet_str.substr(slash_pos + 1)};
            uint8_t netmask;
            if (ParseUInt8(netmask_str, &netmask)) {
                // Valid number; assume CIDR variable-length subnet masking.
                subnet = CSubNet{addr.value(), netmask};
            } else {
                // Invalid number; try full netmask syntax. Never allow lookup for netmask.
                const std::optional<CNetAddr> full_netmask{LookupHost(netmask_str, /*fAllowLookup=*/false)};
                if (full_netmask.has_value()) {
                    subnet = CSubNet{addr.value(), full_netmask.value()};
                }
            }
        } else {
            // Single IP subnet (<ipv4>/32 or <ipv6>/128).
            subnet = CSubNet{addr.value()};
        }
    }

    return subnet;
}